

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_value.cpp
# Opt level: O1

void duckdb::ArrayValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  reference pvVar2;
  Vector *vector;
  size_type __n;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  LogicalType array_type;
  Value val;
  LogicalType local_c8 [24];
  Value local_b0 [64];
  LogicalType local_70 [64];
  
  duckdb::LogicalType::LogicalType(local_c8,(LogicalType *)(result + 8));
  duckdb::ArrayType::GetChildType(local_c8);
  duckdb::Vector::SetVectorType((VectorType)result);
  if (*(long *)(args + 8) == *(long *)args) {
    uVar5 = 0;
  }
  else {
    __n = 0;
    do {
      pvVar2 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,__n);
      if (*pvVar2 != (value_type)0x2) {
        duckdb::Vector::SetVectorType((VectorType)result);
      }
      __n = __n + 1;
      uVar5 = (*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (__n < uVar5);
  }
  lVar1 = *(long *)(args + 0x18);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(result);
  if (1 < uVar5) {
    FlatVector::VerifyFlatVector(vector);
    duckdb::ValidityMask::Resize((ulong)(vector + 0x28));
  }
  if (lVar1 != 0) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          duckdb::DataChunk::GetValue((ulong)local_b0,(ulong)args);
          duckdb::Value::DefaultCastAs(local_70,SUB81(local_b0,0));
          duckdb::Value::~Value(local_b0);
          duckdb::Vector::SetValue((ulong)vector,(Value *)(lVar4 + uVar6));
          duckdb::Value::~Value((Value *)local_70);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + uVar5;
    } while (lVar3 != lVar1);
  }
  duckdb::Vector::Verify((ulong)result);
  duckdb::LogicalType::~LogicalType(local_c8);
  return;
}

Assistant:

static void ArrayValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto array_type = result.GetType();

	D_ASSERT(array_type.id() == LogicalTypeId::ARRAY);
	D_ASSERT(args.ColumnCount() == ArrayType::GetSize(array_type));

	auto &child_type = ArrayType::GetChildType(array_type);

	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}

	auto num_rows = args.size();
	auto num_columns = args.ColumnCount();

	auto &child = ArrayVector::GetEntry(result);

	if (num_columns > 1) {
		// Ensure that the child has a validity mask of the correct size
		// The SetValue call below expects the validity mask to be initialized
		auto &child_validity = FlatVector::Validity(child);
		child_validity.Resize(num_rows * num_columns);
	}

	for (idx_t i = 0; i < num_rows; i++) {
		for (idx_t j = 0; j < num_columns; j++) {
			auto val = args.GetValue(j, i).DefaultCastAs(child_type);
			child.SetValue((i * num_columns) + j, val);
		}
	}

	result.Verify(args.size());
}